

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64
drwav_read_pcm_frames_s16__ima(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint32 *pdVar1;
  drwav_uint64 dVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  drwav_uint64 dVar8;
  drwav_int32 *pdVar9;
  drwav_uint64 dVar10;
  drwav_uint32 dVar11;
  drwav_uint32 *pdVar12;
  long lVar13;
  drwav_uint32 iSample;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  drwav_uint64 dVar17;
  int iVar18;
  drwav_uint64 dVar19;
  int iVar20;
  drwav_int32 dVar21;
  drwav_uint8 header [4];
  short local_6c;
  byte local_6a;
  long local_58;
  drwav_uint32 *local_50;
  
  pdVar1 = &(pWav->ima).cachedFrameCount;
  dVar8 = 0;
LAB_001066da:
  do {
    dVar19 = framesToRead;
    dVar17 = dVar8;
    if (dVar19 == 0) {
      return dVar17;
    }
    if (pWav->totalPCMFrameCount <= (pWav->compressed).iCurrentPCMFrame) {
      return dVar17;
    }
    uVar5 = (pWav->ima).cachedFrameCount;
    if ((uVar5 == 0) && (uVar5 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,4);
        if (sVar6 != 4) {
          return dVar17;
        }
        dVar11 = (pWav->fmt).blockAlign - 4;
        (pWav->ima).bytesRemainingInBlock = dVar11;
        if (0x58 < header[2]) {
LAB_00106b2b:
          (*pWav->onSeek)(pWav->pUserData,dVar11,drwav_seek_origin_current);
          (pWav->ima).bytesRemainingInBlock = 0;
          return dVar17;
        }
        (pWav->ima).predictor[0] = (int)(short)header._0_2_;
        (pWav->ima).stepIndex[0] = (uint)header[2];
        (pWav->ima).cachedFrames[0xf] = (int)(short)header._0_2_;
      }
      else {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,8);
        if (sVar6 != 8) {
          return dVar17;
        }
        dVar11 = (pWav->fmt).blockAlign - 8;
        (pWav->ima).bytesRemainingInBlock = dVar11;
        if ((0x58 < header[2]) || (0x58 < local_6a)) goto LAB_00106b2b;
        (pWav->ima).predictor[0] = (int)(short)header._0_2_;
        (pWav->ima).stepIndex[0] = (uint)header[2];
        (pWav->ima).predictor[1] = (int)local_6c;
        (pWav->ima).stepIndex[1] = (uint)local_6a;
        (pWav->ima).cachedFrames[0xe] = (int)(short)header._0_2_;
        (pWav->ima).cachedFrames[0xf] = (int)local_6c;
      }
      (pWav->ima).cachedFrameCount = 1;
      uVar5 = 1;
    }
    dVar2 = dVar17 + uVar5;
    dVar10 = dVar19 - uVar5;
    dVar8 = dVar17;
    framesToRead = dVar19;
    while( true ) {
      if (framesToRead == 0) {
        return dVar17 + dVar19;
      }
      if (uVar5 == 0) break;
      uVar7 = (pWav->compressed).iCurrentPCMFrame;
      if (pWav->totalPCMFrameCount <= uVar7) goto LAB_001066da;
      if (pBufferOut == (drwav_int16 *)0x0) {
        pBufferOut = (drwav_int16 *)0x0;
      }
      else {
        uVar14 = 0;
        while( true ) {
          uVar4 = pWav->channels;
          if (uVar4 <= uVar14) break;
          pBufferOut[uVar14] = (drwav_int16)pdVar1[uVar14 - uVar5 * uVar4];
          uVar14 = uVar14 + 1;
        }
        pBufferOut = pBufferOut + uVar4;
      }
      dVar8 = dVar8 + 1;
      (pWav->compressed).iCurrentPCMFrame = uVar7 + 1;
      (pWav->ima).cachedFrameCount = uVar5 - 1;
      framesToRead = framesToRead - 1;
      uVar5 = uVar5 - 1;
    }
    dVar8 = dVar2;
    framesToRead = dVar10;
    if ((pWav->ima).bytesRemainingInBlock != 0) {
      (pWav->ima).cachedFrameCount = 8;
      uVar7 = (ulong)pWav->channels;
      local_58 = 0x10;
      local_50 = pdVar1;
      for (uVar14 = 0; uVar14 < uVar7; uVar14 = uVar14 + 1) {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,4);
        if (sVar6 != 4) {
          (pWav->ima).cachedFrameCount = 0;
          return dVar2;
        }
        (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
        uVar4 = pWav->channels;
        uVar7 = (ulong)uVar4;
        pdVar9 = (pWav->ima).cachedFrames + uVar7 + local_58;
        pdVar12 = local_50;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          bVar3 = header[lVar13];
          uVar16 = bVar3 & 0xf;
          iVar15 = (pWav->ima).stepIndex[uVar14];
          uVar5 = drwav_read_pcm_frames_s16__ima::stepTable[iVar15];
          iVar18 = ((int)(uVar16 << 0x1d) >> 0x1f & uVar5) +
                   ((int)uVar5 >> 1 & (int)(uVar16 << 0x1e) >> 0x1f) +
                   ((int)uVar5 >> 2 & -(bVar3 & 1)) + ((int)uVar5 >> 3);
          iVar20 = -iVar18;
          if ((byte)uVar16 < 8) {
            iVar20 = iVar18;
          }
          dVar11 = iVar20 + (pWav->ima).predictor[uVar14];
          if (0x7ffe < (int)dVar11) {
            dVar11 = 0x7fff;
          }
          if ((int)dVar11 < -0x7fff) {
            dVar11 = 0xffff8000;
          }
          (pWav->ima).predictor[uVar14] = dVar11;
          iVar15 = iVar15 + drwav_read_pcm_frames_s16__ima::indexTable[uVar16];
          if (0x57 < iVar15) {
            iVar15 = 0x58;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          (pWav->ima).stepIndex[uVar14] = iVar15;
          pdVar12[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar4)] = dVar11;
          iVar15 = (pWav->ima).stepIndex[uVar14];
          uVar5 = drwav_read_pcm_frames_s16__ima::stepTable[iVar15];
          iVar18 = ((int)((uint)bVar3 << 0x19) >> 0x1f & uVar5) + ((int)uVar5 >> 3) +
                   ((int)uVar5 >> 2 & -(uint)((bVar3 >> 4 & 1) != 0)) +
                   ((int)uVar5 >> 1 & (int)((uint)bVar3 << 0x1a) >> 0x1f);
          iVar20 = -iVar18;
          if (-1 < (char)bVar3) {
            iVar20 = iVar18;
          }
          dVar21 = iVar20 + (pWav->ima).predictor[uVar14];
          if (0x7ffe < dVar21) {
            dVar21 = 0x7fff;
          }
          if (dVar21 < -0x7fff) {
            dVar21 = -0x8000;
          }
          (pWav->ima).predictor[uVar14] = dVar21;
          iVar15 = iVar15 + drwav_read_pcm_frames_s16__ima::indexTable[bVar3 >> 4];
          if (0x57 < iVar15) {
            iVar15 = 0x58;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          (pWav->ima).stepIndex[uVar14] = iVar15;
          pdVar9[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar4)] = dVar21;
          pdVar9 = (drwav_int32 *)((long)pdVar9 + (ulong)((uint)uVar4 * 8));
          pdVar12 = (drwav_uint32 *)((long)pdVar12 + (ulong)((uint)uVar4 * 8));
        }
        local_58 = local_58 + 1;
        local_50 = local_50 + 1;
      }
    }
  } while( true );
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s16__ima(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 totalFramesRead = 0;
    drwav_uint32 iChannel;

    static drwav_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };

    static drwav_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17, 
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45, 
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118, 
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066, 
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899, 
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767 
    };

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(framesToRead > 0);

    /* TODO: Lots of room for optimization here. */

    while (framesToRead > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
        /* If there are no cached samples we need to load a new block. */
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                /* Mono. */
                drwav_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                /* Stereo. */
                drwav_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable) || header[6] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.predictor[1] = drwav__bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = header[6];

                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }

        /* Output anything that's cached. */
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                drwav_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (drwav_int16)pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }

            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->compressed.iCurrentPCMFrame += 1;
            pWav->ima.cachedFrameCount -= 1;
        }

        if (framesToRead == 0) {
            return totalFramesRead;
        }

        /*
        If there's nothing left in the cache, just go ahead and load more. If there's nothing left to load in the current block we just continue to the next
        loop iteration which will trigger the loading of a new block.
        */
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                /*
                From what I can tell with stereo streams, it looks like every 4 bytes (8 samples) is for one channel. So it goes 4 bytes for the
                left channel, 4 bytes for the right channel.
                */
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    drwav_uint32 iByte;
                    drwav_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;

                    for (iByte = 0; iByte < 4; ++iByte) {
                        drwav_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        drwav_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);

                        drwav_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        drwav_int32 predictor = pWav->ima.predictor[iChannel];

                        drwav_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;


                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];

                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }

    return totalFramesRead;
}